

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

uint nullcGetBytecodeNoCache(char **bytecode)

{
  uint uVar1;
  int iVar2;
  TraceScope traceScope;
  TraceScope TStack_18;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    uVar1 = 0;
  }
  else {
    if (nullcGetBytecodeNoCache::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcGetBytecodeNoCache::token);
      if (iVar2 != 0) {
        nullcGetBytecodeNoCache::token = NULLC::TraceGetToken("nullc","nullcGetBytecodeNoCache");
        __cxa_guard_release(&nullcGetBytecodeNoCache::token);
      }
    }
    NULLC::TraceScope::TraceScope(&TStack_18,nullcGetBytecodeNoCache::token);
    if (NULLC::compilerCtx == (CompilerContext *)0x0) {
      NULLC::nullcLastError = "ERROR: there is no active compiler context";
      uVar1 = 0;
    }
    else {
      uVar1 = GetBytecode(NULLC::compilerCtx,bytecode);
    }
    NULLC::TraceScope::~TraceScope(&TStack_18);
  }
  return uVar1;
}

Assistant:

unsigned nullcGetBytecodeNoCache(char **bytecode)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	TRACE_SCOPE("nullc", "nullcGetBytecodeNoCache");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	return GetBytecode(*compilerCtx, bytecode);
}